

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O1

void __thiscall
GameInfoIRCCommand::trigger
          (GameInfoIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  undefined4 uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  char *pcVar8;
  size_t sVar9;
  undefined8 extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3;
  bool bVar10;
  ulong uVar11;
  bool bVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  IRC_Bot *local_98;
  size_t local_90;
  char *local_88;
  undefined4 local_7c;
  long local_78;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  long local_60 [2];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  args_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)nick._M_str;
  pcVar8 = channel._M_str;
  sVar9 = channel._M_len;
  local_98 = source;
  lVar3 = Jupiter::IRC::Client::getChannel(source,sVar9,pcVar8,pcVar8,nick._M_len);
  if (lVar3 != 0) {
    uVar2 = Jupiter::IRC::Client::Channel::getType();
    RenX::getCore();
    lVar3 = RenX::Core::getServerCount();
    if (lVar3 != 0) {
      bVar10 = false;
      uVar11 = 1;
      local_90 = sVar9;
      local_88 = pcVar8;
      local_7c = uVar2;
      do {
        uVar4 = RenX::getCore();
        lVar3 = RenX::Core::getServer(uVar4);
        cVar1 = RenX::Server::isLogChanType((int)lVar3);
        if (cVar1 != '\0') {
          lVar5 = RenX::Server::getMap();
          lVar6 = RenX::Server::getGameTime();
          uVar7 = RenX::Server::getGameVersion();
          RenX::Server::getGameVersion();
          string_printf_abi_cxx11_(&local_b8,"\x0303[GameInfo] \x03%.*s",uVar7,extraout_RDX);
          Jupiter::IRC::Client::sendMessage
                    (local_98,local_90,local_88,local_b8._M_string_length,local_b8._M_dataplus._M_p)
          ;
          local_78 = lVar6;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          local_40._0_8_ = 0x17;
          local_40._8_8_ = "\x0303[GameInfo] \x0310Map\x03: ";
          local_50._0_8_ = (pointer)0xc;
          local_50._8_8_ = "; \x0310GUID\x03: ";
          RenX::formatGUID_abi_cxx11_((Map *)&local_70);
          jessilib::
          join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
                    (&local_b8,(jessilib *)local_40,
                     (basic_string_view<char,_std::char_traits<char>_> *)(lVar5 + 0x10),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     &local_70,args_3);
          pcVar8 = local_88;
          sVar9 = local_90;
          Jupiter::IRC::Client::sendMessage
                    (local_98,local_90,local_88,local_b8._M_string_length,local_b8._M_dataplus._M_p)
          ;
          lVar5 = local_78;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if ((long *)local_70._M_len != local_60) {
            operator_delete((void *)local_70._M_len,local_60[0] + 1);
          }
          string_printf_abi_cxx11_
                    (&local_b8,"\x0303[GameInfo] \x0310Elapsed time\x03: %.2lld:%.2lld:%.2lld",
                     lVar5 / 3600000,((lVar6 / 1000) % 0xe10) / 0x3c,(lVar6 / 1000) % 0x3c);
          Jupiter::IRC::Client::sendMessage
                    (local_98,sVar9,pcVar8,local_b8._M_string_length,local_b8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          string_printf_abi_cxx11_
                    (&local_b8,"\x0303[GameInfo] \x03There are \x0310%d\x03 players online.",
                     *(undefined8 *)(lVar3 + 0x20));
          Jupiter::IRC::Client::sendMessage
                    (local_98,sVar9,pcVar8,local_b8._M_string_length,local_b8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          bVar10 = true;
        }
        RenX::getCore();
        uVar4 = RenX::Core::getServerCount();
        bVar12 = uVar4 != uVar11;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (bVar12);
      pcVar8 = local_88;
      sVar9 = local_90;
      if (bVar10) {
        return;
      }
    }
    Jupiter::IRC::Client::sendMessage
              (local_98,sVar9,pcVar8,0x40,
               "Error: Channel not attached to any connected Renegade X servers.");
  }
  return;
}

Assistant:

void GameInfoIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr)
	{
		int type = chan->getType();
		bool match = false;
		for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
		{
			RenX::Server *server = RenX::getCore()->getServer(i);
			if (server->isLogChanType(type))
			{
				match = true;
				const RenX::Map &map = server->getMap();
				std::chrono::seconds time = std::chrono::duration_cast<std::chrono::seconds>(server->getGameTime());
				source->sendMessage(channel, string_printf(IRCCOLOR "03[GameInfo] " IRCCOLOR "%.*s", server->getGameVersion().size(), server->getGameVersion().data()));
				source->sendMessage(channel, jessilib::join<std::string>(IRCCOLOR "03[GameInfo] " IRCCOLOR "10Map" IRCCOLOR ": "sv, map.name, "; " IRCCOLOR "10GUID" IRCCOLOR ": "sv, RenX::formatGUID(map)));
				source->sendMessage(channel, string_printf(IRCCOLOR "03[GameInfo] " IRCCOLOR "10Elapsed time" IRCCOLOR ": %.2lld:%.2lld:%.2lld", time.count() / 3600, (time.count() % 3600) / 60, time.count() % 60));
				source->sendMessage(channel, string_printf(IRCCOLOR "03[GameInfo] " IRCCOLOR "There are " IRCCOLOR "10%d" IRCCOLOR " players online.", server->players.size()));
			}
		}
		if (match == false)
			source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
	}
}